

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

QString * QCoreApplication::applicationVersion(void)

{
  Data *pDVar1;
  Type *pTVar2;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *this;
  
  this = in_RDI;
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
           operator()(in_RDI);
  if (pTVar2 == (Type *)0x0) {
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  else {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
             operator()(this);
    pDVar1 = (pTVar2->applicationVersion).d.d;
    *(Data **)in_RDI = pDVar1;
    *(char16_t **)(in_RDI + 8) = (pTVar2->applicationVersion).d.ptr;
    *(qsizetype *)(in_RDI + 0x10) = (pTVar2->applicationVersion).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return (QString *)in_RDI;
}

Assistant:

QString QCoreApplication::applicationVersion()
{
    return coreappdata() ? coreappdata()->applicationVersion : QString();
}